

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cc_helper.c
# Opt level: O2

uint32_t compute_all_addx_xcc(CPUSPARCState_conflict2 *env)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar1 = (uint)(env->cc_dst >> 0x20);
  uVar4 = 0x400000;
  if (env->cc_dst != 0) {
    uVar4 = uVar1 >> 8 & 0x800000;
  }
  uVar2 = (uint)(env->cc_src2 >> 0x20);
  uVar3 = (uint)(env->cc_src >> 0x20);
  return ((uVar3 ^ uVar1) & ~(uVar3 ^ uVar2)) >> 10 & 0x200000 | uVar4 |
         ((uVar2 | uVar3) & ~uVar1 | uVar2 & uVar3) >> 0xb & 0x100000;
}

Assistant:

static uint32_t compute_all_addx_xcc(CPUSPARCState *env)
{
    uint32_t ret;

    ret = get_NZ_xcc(CC_DST);
    ret |= get_C_addx_xcc(CC_DST, CC_SRC, CC_SRC2);
    ret |= get_V_add_xcc(CC_DST, CC_SRC, CC_SRC2);
    return ret;
}